

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O1

BBox3fa * __thiscall
embree::sse2::LineSegmentsISA::vbounds
          (BBox3fa *__return_storage_ptr__,LineSegmentsISA *this,LinearSpace3fa *space,size_t i)

{
  float *pfVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  
  pcVar3 = (this->super_LineSegments).vertices0.super_RawBufferView.ptr_ofs;
  uVar2 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_LineSegments).field_0x68);
  sVar4 = (this->super_LineSegments).vertices0.super_RawBufferView.stride;
  pfVar1 = (float *)(pcVar3 + uVar2 * sVar4);
  fVar22 = *pfVar1;
  fVar23 = pfVar1[1];
  fVar24 = pfVar1[2];
  fVar6 = pfVar1[3];
  pfVar1 = (float *)(pcVar3 + (uVar2 + 1) * sVar4);
  fVar7 = *pfVar1;
  fVar8 = pfVar1[1];
  fVar9 = pfVar1[2];
  fVar19 = pfVar1[3];
  fVar10 = (space->vx).field_0.m128[0];
  fVar11 = (space->vx).field_0.m128[1];
  fVar12 = (space->vx).field_0.m128[2];
  fVar13 = (space->vy).field_0.m128[0];
  fVar14 = (space->vy).field_0.m128[1];
  fVar15 = (space->vy).field_0.m128[2];
  fVar16 = (space->vz).field_0.m128[0];
  fVar17 = (space->vz).field_0.m128[1];
  fVar18 = (space->vz).field_0.m128[2];
  auVar20._8_4_ = fVar22 * fVar12 + fVar23 * fVar15 + fVar24 * fVar18;
  auVar20._0_8_ =
       CONCAT44(fVar22 * fVar11 + fVar23 * fVar14 + fVar24 * fVar17,
                fVar22 * fVar10 + fVar23 * fVar13 + fVar24 * fVar16);
  auVar20._12_4_ = fVar6;
  fVar22 = fVar7 * fVar10 + fVar8 * fVar13 + fVar9 * fVar16;
  fVar23 = fVar7 * fVar11 + fVar8 * fVar14 + fVar9 * fVar17;
  fVar24 = fVar7 * fVar12 + fVar8 * fVar15 + fVar9 * fVar18;
  auVar25._8_4_ = auVar20._8_4_;
  auVar25._0_8_ = auVar20._0_8_;
  auVar25._12_4_ = fVar6;
  auVar21._4_4_ = fVar23;
  auVar21._0_4_ = fVar22;
  auVar21._8_4_ = fVar24;
  auVar21._12_4_ = fVar19;
  auVar25 = minps(auVar25,auVar21);
  auVar5._4_4_ = fVar23;
  auVar5._0_4_ = fVar22;
  auVar5._8_4_ = fVar24;
  auVar5._12_4_ = fVar19;
  auVar21 = maxps(auVar20,auVar5);
  if (fVar19 <= fVar6) {
    fVar19 = fVar6;
  }
  fVar19 = fVar19 * (this->super_LineSegments).maxRadiusScale;
  (__return_storage_ptr__->lower).field_0.m128[0] = auVar25._0_4_ - fVar19;
  (__return_storage_ptr__->lower).field_0.m128[1] = auVar25._4_4_ - fVar19;
  (__return_storage_ptr__->lower).field_0.m128[2] = auVar25._8_4_ - fVar19;
  (__return_storage_ptr__->lower).field_0.m128[3] = auVar25._12_4_ - fVar19;
  (__return_storage_ptr__->upper).field_0.m128[0] = fVar19 + auVar21._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = fVar19 + auVar21._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = fVar19 + auVar21._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = fVar19 + auVar21._12_4_;
  return __return_storage_ptr__;
}

Assistant:

__forceinline const T& operator [](size_t i) const { assert(i<num); return *(T*)(ptr_ofs + i*stride); }